

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status parse_pchars(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  curi_status cVar1;
  _func_void_ptr_void_ptr_size_t *p_Stack_40;
  curi_status subStatus;
  size_t subOffset;
  void *pvStack_30;
  curi_status status;
  void *userData_local;
  curi_settings *settings_local;
  size_t *offset_local;
  size_t len_local;
  char *uri_local;
  
  pvStack_30 = userData;
  userData_local = settings;
  settings_local = (curi_settings *)offset;
  offset_local = (size_t *)len;
  len_local = (size_t)uri;
  while( true ) {
    subOffset._4_4_ = curi_status_success;
    p_Stack_40 = settings_local->allocate;
    cVar1 = parse_pchar((char *)len_local,(size_t)offset_local,(size_t *)&stack0xffffffffffffffc0,
                        (curi_settings *)userData_local,pvStack_30);
    if (cVar1 != curi_status_success) break;
    settings_local->allocate = p_Stack_40;
  }
  return subOffset._4_4_;
}

Assistant:

static curi_status parse_pchars(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // pchars = *pchar

    curi_status status = curi_status_success;

    while (status == curi_status_success)
    {
        size_t subOffset = *offset;
        curi_status subStatus = parse_pchar(uri, len, &subOffset, settings, userData);

        if (subStatus == curi_status_success)
        {
            *offset = subOffset;
            status = curi_status_success;
        }
        else
            break;
    }

    return status;
}